

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O3

bool __thiscall cmParseCacheCoverage::ReadCMCovFile(cmParseCacheCoverage *this,char *file)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  char *__s;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  mapped_type *this_00;
  pointer piVar8;
  ulong uVar9;
  ulong uVar10;
  iterator __position;
  istream *piVar11;
  istream *piVar12;
  pointer pbVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  separateLine;
  string routine;
  string line;
  string filepath;
  ostringstream cmCTestLog_msg;
  ifstream in;
  undefined1 auStack_468 [8];
  cmParseMumpsCoverage *local_460;
  long *local_458;
  long local_448 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  char *local_3b8;
  undefined1 local_3b0 [376];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_460 = &this->super_cmParseMumpsCoverage;
  std::ifstream::ifstream(local_238,file,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"Can not open : ",0xf);
    if (file == (char *)0x0) {
      std::ios::clear((int)auStack_468 +
                      (int)*(undefined8 *)(CONCAT44(local_3b0._4_4_,local_3b0._0_4_) + -0x18) + 0xb8
                     );
    }
    else {
      sVar6 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,file,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"\n",1);
    pcVar1 = local_460->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x61,local_3f8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                               local_3f8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
    bVar4 = false;
LAB_00182332:
    std::ifstream::~ifstream(local_238);
    return bVar4;
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar11 = (istream *)local_238;
  bVar4 = cmsys::SystemTools::GetLineFromStream(piVar11,&local_3f8,(bool *)0x0,-1);
  pbVar3 = local_438.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = local_438.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"Empty file : ",0xd);
    if (file == (char *)0x0) {
      std::ios::clear((int)auStack_468 +
                      (int)*(undefined8 *)(CONCAT44(local_3b0._4_4_,local_3b0._0_4_) + -0x18) + 0xb8
                     );
    }
    else {
      sVar6 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,file,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"  referenced in this line of cmcov data:\n[",0x2a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b0,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
    pcVar1 = local_460->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x6b,local_418._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,
                      CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                               local_418.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
    bVar4 = false;
LAB_0018230e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                               local_3f8.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_00182332;
  }
  if (local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    piVar12 = (istream *)
              &(local_438.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      piVar11 = *(istream **)(piVar12 + -0x10);
      if (piVar12 != piVar11) {
        operator_delete(piVar11,*(long *)piVar12 + 1);
      }
      pbVar13 = (pointer)(piVar12 + 0x10);
      piVar12 = piVar12 + 0x20;
    } while (pbVar13 != pbVar3);
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
  }
  SplitString((cmParseCacheCoverage *)piVar11,&local_438,&local_3f8);
  if ((long)local_438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    iVar5 = std::__cxx11::string::compare
                      ((char *)local_438.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      iVar5 = std::__cxx11::string::compare
                        ((char *)(local_438.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar5 == 0) {
        iVar5 = std::__cxx11::string::compare
                          ((char *)(local_438.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2));
        if (iVar5 == 0) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)(local_438.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 3));
          if (iVar5 == 0) goto LAB_00181c0a;
        }
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,"Bad first line of cmcov file : ",0x1f);
  if (file == (char *)0x0) {
    std::ios::clear((int)auStack_468 +
                    (int)*(undefined8 *)(CONCAT44(local_3b0._4_4_,local_3b0._0_4_) + -0x18) + 0xb8);
  }
  else {
    sVar6 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,file,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"  line:\n[",9);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3b0,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
  pcVar1 = local_460->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
               ,0x77,local_418._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,
                    CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                             local_418.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
LAB_00181c0a:
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  local_3d8._M_string_length = 0;
  local_3d8.field_2._M_local_buf[0] = '\0';
  local_3b8 = file;
LAB_00181c42:
  piVar11 = (istream *)local_238;
  bVar4 = cmsys::SystemTools::GetLineFromStream(piVar11,&local_3f8,(bool *)0x0,-1);
  pbVar3 = local_438.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = local_438.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar4) {
    if (local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      piVar12 = (istream *)
                &(local_438.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        piVar11 = *(istream **)(piVar12 + -0x10);
        if (piVar12 != piVar11) {
          operator_delete(piVar11,*(long *)piVar12 + 1);
        }
        pbVar13 = (pointer)(piVar12 + 0x10);
        piVar12 = piVar12 + 0x20;
      } while (pbVar13 != pbVar3);
      local_438.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    }
    SplitString((cmParseCacheCoverage *)piVar11,&local_438,&local_3f8);
    if (0x7f < (ulong)((long)local_438.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_438.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      if (local_418._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_418);
        bVar4 = cmParseMumpsCoverage::FindMumpsFile(local_460,&local_418,&local_3d8);
        if (bVar4) goto LAB_00181d64;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Could not find mumps file for routine: ",0x27);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3b0,local_418._M_dataplus._M_p,
                            local_418._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        pcVar1 = local_460->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x97,(char *)local_458,false);
        if (local_458 != local_448) {
          operator_delete(local_458,local_448[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
        local_3d8._M_string_length = 0;
        *local_3d8._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::string::substr
                  ((ulong)local_3b0,
                   (ulong)local_438.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        iVar5 = std::__cxx11::string::compare((char *)local_3b0);
        if ((undefined1 *)CONCAT44(local_3b0._4_4_,local_3b0._0_4_) != local_3b0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_3b0._4_4_,local_3b0._0_4_),
                          local_3b0._16_8_ + 1);
        }
        if (iVar5 == 0) {
          local_418._M_string_length = 0;
          *local_418._M_dataplus._M_p = '\0';
          local_3d8._M_string_length = 0;
          *local_3d8._M_dataplus._M_p = '\0';
        }
        else {
LAB_00181d64:
          if (local_3d8._M_string_length != 0) {
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&local_460->Coverage->TotalCoverage,&local_3d8);
            pbVar2 = local_438.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar5 = atoi(local_438.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
            uVar10 = (ulong)(iVar5 + -1);
            iVar5 = atoi(pbVar2[2]._M_dataplus._M_p);
            piVar8 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            __position._M_current =
                 (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            uVar9 = (long)__position._M_current - (long)piVar8 >> 2;
            bVar4 = uVar9 < uVar10;
            if (bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,
                         "Parse error line is greater than number of lines in file: ",0x3a);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_3b0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_3d8._M_dataplus._M_p,local_3d8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              pcVar1 = local_460->CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                           ,0xb4,(char *)local_458,false);
              if (local_458 != local_448) {
                operator_delete(local_458,local_448[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
              std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
            }
            else {
              while (bVar4 || uVar9 == uVar10) {
                local_3b0._0_4_ = 0xffffffff;
                if (__position._M_current ==
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (this_00,__position,(int *)local_3b0);
                  piVar8 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  __position._M_current =
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                }
                else {
                  *__position._M_current = -1;
                  __position._M_current = __position._M_current + 1;
                  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current;
                }
                uVar9 = (long)__position._M_current - (long)piVar8 >> 2;
                bVar4 = uVar9 < uVar10;
              }
              if ((piVar8[uVar10] == -1) && (0 < iVar5)) {
                piVar8[uVar10] = iVar5;
              }
              else {
                piVar8[uVar10] = piVar8[uVar10] + iVar5;
              }
            }
          }
        }
      }
      goto LAB_00181c42;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Bad line of cmcov file expected at least 4 found: ",0x32);
    __s = local_3b8;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  line:\n[",9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
    pcVar1 = local_460->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x88,(char *)local_458,false);
    if (local_458 != local_448) {
      operator_delete(local_458,local_448[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
    if (local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_438.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar9 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"",0);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3b0,
                            local_438.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                            local_438.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar1 = local_460->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x8a,(char *)local_458,false);
        if (local_458 != local_448) {
          operator_delete(local_458,local_448[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)local_438.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_438.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"\n",1);
    pcVar1 = local_460->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x8c,(char *)local_458,false);
    if (local_458 != local_448) {
      operator_delete(local_458,local_448[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,
                    CONCAT71(local_3d8.field_2._M_allocated_capacity._1_7_,
                             local_3d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,
                    CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                             local_418.field_2._M_local_buf[0]) + 1);
  }
  bVar4 = !bVar4;
  goto LAB_0018230e;
}

Assistant:

bool cmParseCacheCoverage::ReadCMCovFile(const char* file)
{
  cmsys::ifstream in(file);
  if (!in) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Can not open : " << file << "\n");
    return false;
  }
  std::string line;
  std::vector<std::string> separateLine;
  if (!cmSystemTools::GetLineFromStream(in, line)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Empty file : " << file
                               << "  referenced in this line of cmcov data:\n"
                                  "["
                               << line << "]\n");
    return false;
  }
  separateLine.clear();
  this->SplitString(separateLine, line);
  if (separateLine.size() != 4 || separateLine[0] != "Routine" ||
      separateLine[1] != "Line" || separateLine[2] != "RtnLine" ||
      separateLine[3] != "Code") {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Bad first line of cmcov file : " << file
                                                 << "  line:\n"
                                                    "["
                                                 << line << "]\n");
  }
  std::string routine;
  std::string filepath;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    // clear out line argument vector
    separateLine.clear();
    // parse the comma separated line
    this->SplitString(separateLine, line);
    // might have more because code could have a quoted , in it
    // but we only care about the first 3 args anyway
    if (separateLine.size() < 4) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Bad line of cmcov file expected at least 4 found: "
                   << separateLine.size() << " " << file
                   << "  line:\n"
                      "["
                   << line << "]\n");
      for (std::string::size_type i = 0; i < separateLine.size(); ++i) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, "" << separateLine[1] << " ");
      }
      cmCTestLog(this->CTest, ERROR_MESSAGE, "\n");
      return false;
    }
    // if we do not have a routine yet, then it should be
    // the first argument in the vector
    if (routine.empty()) {
      routine = separateLine[0];
      // Find the full path to the file
      if (!this->FindMumpsFile(routine, filepath)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Could not find mumps file for routine: " << routine
                                                             << "\n");
        filepath.clear();
        continue; // move to next line
      }
    }
    // if we have a routine name, check for end of routine
    else {
      // Totals in arg 0 marks the end of a routine
      if (separateLine[0].substr(0, 6) == "Totals") {
        routine.clear(); // at the end of this routine
        filepath.clear();
        continue; // move to next line
      }
    }
    // if the file path was not found for the routine
    // move to next line. We should have already warned
    // after the call to FindMumpsFile that we did not find
    // it, so don't report again to cut down on output
    if (filepath.empty()) {
      continue;
    }
    // now we are ready to set the coverage from the line of data
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector =
      this->Coverage.TotalCoverage[filepath];
    std::string::size_type linenumber = atoi(separateLine[1].c_str()) - 1;
    int count = atoi(separateLine[2].c_str());
    if (linenumber > coverageVector.size()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Parse error line is greater than number of lines in file: "
                   << linenumber << " " << filepath << "\n");
      continue; // skip setting count to avoid crash
    }
    // now add to count for linenumber
    // for some reason the cache coverage adds extra lines to the
    // end of the file in some cases. Since they do not exist, we will
    // mark them as non executable
    while (linenumber >= coverageVector.size()) {
      coverageVector.push_back(-1);
    }
    // Accounts for lines that were previously marked
    // as non-executable code (-1). if the parser comes back with
    // a non-zero count, increase the count by 1 to push the line
    // into the executable code set in addition to the count found.
    if (coverageVector[linenumber] == -1 && count > 0) {
      coverageVector[linenumber] += count + 1;
    } else {
      coverageVector[linenumber] += count;
    }
  }
  return true;
}